

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O3

void __thiscall smf::MidiEvent::linkEvent(MidiEvent *this,MidiEvent *mev)

{
  MidiEvent **ppMVar1;
  MidiEvent *pMVar2;
  MidiEvent *pMVar3;
  MidiEvent **ppMVar4;
  MidiEvent *pMVar5;
  
  if (mev->m_eventlink != (MidiEvent *)0x0) {
    ppMVar4 = &mev->m_eventlink;
    pMVar3 = mev->m_eventlink;
    do {
      *ppMVar4 = (MidiEvent *)0x0;
      ppMVar1 = &pMVar3->m_eventlink;
      ppMVar4 = &pMVar3->m_eventlink;
      pMVar3 = *ppMVar1;
    } while (*ppMVar1 != (MidiEvent *)0x0);
  }
  pMVar3 = this->m_eventlink;
  if (pMVar3 != (MidiEvent *)0x0) {
    ppMVar4 = &this->m_eventlink;
    pMVar2 = pMVar3->m_eventlink;
    if (pMVar3->m_eventlink != (MidiEvent *)0x0) {
      do {
        pMVar5 = pMVar2;
        pMVar3->m_eventlink = (MidiEvent *)0x0;
        pMVar2 = pMVar5->m_eventlink;
        pMVar3 = pMVar5;
      } while (pMVar2 != (MidiEvent *)0x0);
      pMVar3 = *ppMVar4;
      if (*ppMVar4 == (MidiEvent *)0x0) goto LAB_00115307;
    }
    do {
      *ppMVar4 = (MidiEvent *)0x0;
      ppMVar1 = &pMVar3->m_eventlink;
      ppMVar4 = &pMVar3->m_eventlink;
      pMVar3 = *ppMVar1;
    } while (*ppMVar1 != (MidiEvent *)0x0);
  }
LAB_00115307:
  mev->m_eventlink = this;
  this->m_eventlink = mev;
  return;
}

Assistant:

void MidiEvent::linkEvent(MidiEvent* mev) {
	if (mev->m_eventlink != NULL) {
		// unlink other event if it is linked to something else;
		mev->unlinkEvent();
	}
	// if this is already linked to something else, then unlink:
	if (m_eventlink != NULL) {
		m_eventlink->unlinkEvent();
	}
	unlinkEvent();

	mev->m_eventlink = this;
	m_eventlink = mev;
}